

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O1

FrameDisplay * __thiscall
Js::StackScriptFunction::BoxState::BoxFrameDisplay(BoxState *this,FrameDisplay *frameDisplay)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  FrameDisplay *pFVar6;
  ushort uVar7;
  uint index;
  undefined1 local_80 [8];
  TrackAllocData data;
  FrameDisplay *local_48;
  FrameDisplay *boxedFrameDisplay;
  FrameDisplay *local_38;
  FrameDisplay *frameDisplay_local;
  
  local_38 = frameDisplay;
  if (frameDisplay == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x264,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar3) goto LAB_00d5fd5e;
    *puVar5 = 0;
  }
  local_48 = (FrameDisplay *)&NullFrameDisplay;
  if (local_38 != (FrameDisplay *)&NullFrameDisplay) {
    local_48 = (FrameDisplay *)0x0;
    bVar3 = JsUtil::
            BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<Js::FrameDisplay*>
                      ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->boxedValues,&local_38,&local_48);
    if (bVar3) {
      return local_48;
    }
    uVar1 = local_38->length;
    bVar3 = ThreadContext::IsOnStack(local_38);
    if (bVar3) {
      local_80 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8fc4f43;
      data.filename._0_4_ = 0x278;
      data.typeinfo = (type_info *)(ulong)((uint)uVar1 * 8);
      boxedFrameDisplay._6_2_ = uVar1;
      this_00 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)local_80);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00d5fd5e;
        *puVar5 = 0;
      }
      pFVar6 = (FrameDisplay *)
               Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                         (this_00,(size_t)((type_info *)(ulong)((uint)uVar1 * 8) + 8));
      uVar7 = boxedFrameDisplay._6_2_;
      if (pFVar6 == (FrameDisplay *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00d5fd5e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pFVar6->tag = true;
      pFVar6->strictMode = false;
      pFVar6->length = uVar7;
      pFVar6->unused = 0;
      local_48 = pFVar6;
    }
    else {
      local_48 = local_38;
      uVar7 = uVar1;
    }
    local_80 = (undefined1  [8])local_38;
    data._32_8_ = local_48;
    JsUtil::
    BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->boxedValues,(void **)local_80,(void **)&data.line);
    if (uVar7 != 0) {
      index = 0;
      do {
        pFVar6 = (FrameDisplay *)FrameDisplay::GetItem(local_38,index);
        if ((pFVar6 != (FrameDisplay *)0x0) && ((ulong)*pFVar6 < 0x10000)) {
          Memory::Recycler::WBSetBit(local_80);
          local_80 = (undefined1  [8])pFVar6;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(local_80);
          pFVar6 = (FrameDisplay *)BoxScopeSlots(this,(Type *)pFVar6,*(uint *)local_80);
        }
        FrameDisplay::SetItem(local_48,index,pFVar6);
        FrameDisplay::SetItem(local_38,index,pFVar6);
        index = index + 1;
      } while (uVar1 != index);
    }
  }
  return local_48;
}

Assistant:

FrameDisplay * StackScriptFunction::BoxState::BoxFrameDisplay(FrameDisplay * frameDisplay)
    {
        Assert(frameDisplay != nullptr);
        if (frameDisplay == &Js::NullFrameDisplay)
        {
            return frameDisplay;
        }

        FrameDisplay * boxedFrameDisplay = nullptr;
        if (boxedValues.TryGetValue(frameDisplay, (void **)&boxedFrameDisplay))
        {
            return boxedFrameDisplay;
        }

        // Create new frame display when we allocate the frame display on the stack
        uint16 length = frameDisplay->GetLength();
        if (!ThreadContext::IsOnStack(frameDisplay))
        {
            boxedFrameDisplay = frameDisplay;
        }
        else
        {
            boxedFrameDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        }
        boxedValues.Add(frameDisplay, boxedFrameDisplay);

        for (uint16 i = 0; i < length; i++)
        {
            // TODO: Once we allocate the slots on the stack, we can only look those slots
            Field(Var) * pScope = (Field(Var) *)frameDisplay->GetItem(i);
            // We don't do stack slots if we exceed max encoded slot count
            if (ScopeSlots::Is(pScope))
            {
                pScope = BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
            }
            boxedFrameDisplay->SetItem(i, pScope);
            frameDisplay->SetItem(i, pScope);
        }
        return boxedFrameDisplay;
    }